

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O0

void __thiscall
TasGrid::Optimizer::CurrentNodes<(TasGrid::TypeOneDRule)15>::~CurrentNodes
          (CurrentNodes<(TasGrid::TypeOneDRule)15> *this)

{
  CurrentNodes<(TasGrid::TypeOneDRule)15> *this_local;
  
  ::std::vector<double,_std::allocator<double>_>::~vector(&this->coeff);
  ::std::vector<double,_std::allocator<double>_>::~vector(&this->nodes);
  return;
}

Assistant:

CurrentNodes(std::vector<double> const &cnodes)
        : nodes(cnodes), coeff(makeCoefficients(cnodes)){}